

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCall.cpp
# Opt level: O1

void __thiscall
ninx::parser::element::FunctionCall::FunctionCall
          (FunctionCall *this,string *name,
          vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
          *arguments,
          unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
          *outer_argument,bool late_call)

{
  pointer pcVar1;
  
  (this->super_Statement).super_ASTElement.parent = (Block *)0x0;
  (this->super_Statement).super_ASTElement.__output_block = (Block *)0x0;
  (this->super_Statement).super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__FunctionCall_00206e50;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  (this->arguments).
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (arguments->
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->arguments).
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (arguments->
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->arguments).
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (arguments->
       super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (arguments->
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (arguments->
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (arguments->
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outer_argument)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl =
       (outer_argument->_M_t).
       super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
       ._M_t.
       super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
       .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl;
  (outer_argument->_M_t).
  super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl =
       (FunctionCallArgument *)0x0;
  this->late_call = late_call;
  return;
}

Assistant:

ninx::parser::element::FunctionCall::FunctionCall(const std::string &name, std::vector<std::unique_ptr<FunctionCallArgument>> arguments,
                                                  std::unique_ptr<FunctionCallArgument> outer_argument, bool late_call)
        : name(name), arguments(std::move(arguments)), outer_argument(std::move(outer_argument)), late_call(late_call) {}